

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void wasm::PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan
               (Vacuum *self,Expression **currp)

{
  Expression *this;
  Block *pBVar1;
  Resume *pRVar2;
  StackSwitch *pSVar3;
  Expression **ppEVar4;
  AtomicWait *pAVar5;
  ContBind *pCVar6;
  TryTable *pTVar7;
  GlobalSet *pGVar8;
  CallRef *pCVar9;
  StructGet *pSVar10;
  Call *pCVar11;
  AtomicCmpxchg *pAVar12;
  CallIndirect *pCVar13;
  Load *pLVar14;
  Try *pTVar15;
  Break *pBVar16;
  Switch *pSVar17;
  ArrayNew *pAVar18;
  Return *pRVar19;
  StructNew *pSVar20;
  SIMDLoad *pSVar21;
  Suspend *pSVar22;
  Store *pSVar23;
  Throw *pTVar24;
  MemoryCopy *pMVar25;
  ResumeThrow *pRVar26;
  TupleMake *pTVar27;
  ArrayNewFixed *pAVar28;
  ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *pEVar29;
  ulong uVar30;
  
  this = *currp;
  switch(this->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                       ,0x103);
  case BlockId:
    pEVar29 = &(self->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>;
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitBlock,currp);
    pBVar1 = Expression::cast<wasm::Block>(this);
    uVar30 = (ulong)(uint)(pBVar1->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pBVar1->list).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
                ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
                 ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
                 ppEVar4);
    }
    break;
  case IfId:
    pEVar29 = &(self->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>;
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitIf,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::If>(this);
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::maybePushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
               &pMVar25->size);
    goto LAB_00bfbc22;
  case LoopId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitLoop,currp);
    pGVar8 = (GlobalSet *)Expression::cast<wasm::Loop>(this);
    goto LAB_00bfb7a3;
  case BreakId:
    pEVar29 = &(self->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>;
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitBreak,currp);
    pBVar16 = Expression::cast<wasm::Break>(this);
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::maybePushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
               &pBVar16->condition);
    ppEVar4 = &pBVar16->value;
    goto LAB_00bfb681;
  case SwitchId:
    pEVar29 = &(self->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>;
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitSwitch,currp);
    pSVar17 = Expression::cast<wasm::Switch>(this);
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
               &pSVar17->condition);
    ppEVar4 = &pSVar17->value;
    goto LAB_00bfb681;
  case CallId:
    pEVar29 = &(self->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>;
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitCall,currp);
    pCVar11 = Expression::cast<wasm::Call>(this);
    uVar30 = (ulong)(uint)(pCVar11->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar11->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
                ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
                 ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
                 ppEVar4);
    }
    break;
  case CallIndirectId:
    pEVar29 = &(self->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>;
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitCallIndirect,currp);
    pCVar13 = Expression::cast<wasm::CallIndirect>(this);
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
               &pCVar13->target);
    uVar30 = (ulong)(uint)(pCVar13->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar13->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
                ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
                 ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
                 ppEVar4);
    }
    break;
  case LocalGetId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitLocalGet,currp);
    Expression::cast<wasm::LocalGet>(this);
    return;
  case LocalSetId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitLocalSet,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::LocalSet>(this);
    goto LAB_00bfba37;
  case GlobalGetId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitGlobalGet,currp);
    Expression::cast<wasm::GlobalGet>(this);
    return;
  case GlobalSetId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitGlobalSet,currp);
    pGVar8 = Expression::cast<wasm::GlobalSet>(this);
    goto LAB_00bfb7a3;
  case LoadId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitLoad,currp);
    pLVar14 = Expression::cast<wasm::Load>(this);
    ppEVar4 = &pLVar14->ptr;
    goto LAB_00bfbc3a;
  case StoreId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitStore,currp);
    pSVar23 = Expression::cast<wasm::Store>(this);
    goto LAB_00bfb9fa;
  case ConstId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitConst,currp);
    Expression::cast<wasm::Const>(this);
    return;
  case UnaryId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitUnary,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::Unary>(this);
    goto LAB_00bfba37;
  case BinaryId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitBinary,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::Binary>(this);
    goto LAB_00bfb994;
  case SelectId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitSelect,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::Select>(this);
    goto LAB_00bfbc13;
  case DropId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitDrop,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::Drop>(this);
    goto LAB_00bfb844;
  case ReturnId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitReturn,currp);
    pRVar19 = Expression::cast<wasm::Return>(this);
    ppEVar4 = &pRVar19->value;
    goto LAB_00bfb681;
  case MemorySizeId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitMemorySize,currp);
    Expression::cast<wasm::MemorySize>(this);
    return;
  case MemoryGrowId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitMemoryGrow,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::MemoryGrow>(this);
    goto LAB_00bfb844;
  case NopId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitNop,currp);
    Expression::cast<wasm::Nop>(this);
    return;
  case UnreachableId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitUnreachable,currp);
    Expression::cast<wasm::Unreachable>(this);
    return;
  case AtomicRMWId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitAtomicRMW,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::AtomicRMW>(this);
    goto LAB_00bfba82;
  case AtomicCmpxchgId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitAtomicCmpxchg,currp)
    ;
    pAVar12 = Expression::cast<wasm::AtomicCmpxchg>(this);
    goto LAB_00bfba73;
  case AtomicWaitId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitAtomicWait,currp);
    pAVar5 = Expression::cast<wasm::AtomicWait>(this);
    goto LAB_00bfb7c7;
  case AtomicNotifyId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitAtomicNotify,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::AtomicNotify>(this);
    goto LAB_00bfb994;
  case AtomicFenceId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitAtomicFence,currp);
    Expression::cast<wasm::AtomicFence>(this);
    return;
  case SIMDExtractId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitSIMDExtract,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::SIMDExtract>(this);
    goto LAB_00bfba37;
  case SIMDReplaceId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitSIMDReplace,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::SIMDReplace>(this);
    ppEVar4 = &pAVar5->timeout;
    goto LAB_00bfb9a2;
  case SIMDShuffleId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitSIMDShuffle,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::SIMDShuffle>(this);
    goto LAB_00bfbc22;
  case SIMDTernaryId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitSIMDTernary,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::SIMDTernary>(this);
    goto LAB_00bfb7c7;
  case SIMDShiftId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitSIMDShift,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::SIMDShift>(this);
    goto LAB_00bfb994;
  case SIMDLoadId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitSIMDLoad,currp);
    pSVar21 = Expression::cast<wasm::SIMDLoad>(this);
    goto LAB_00bfb922;
  case SIMDLoadStoreLaneId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitSIMDLoadStoreLane,
               currp);
    pSVar23 = (Store *)Expression::cast<wasm::SIMDLoadStoreLane>(this);
LAB_00bfb9fa:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
               &pSVar23->value);
    ppEVar4 = &pSVar23->ptr;
    goto LAB_00bfbc3a;
  case MemoryInitId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitMemoryInit,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::MemoryInit>(this);
    goto LAB_00bfba73;
  case DataDropId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitDataDrop,currp);
    Expression::cast<wasm::DataDrop>(this);
    return;
  case MemoryCopyId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitMemoryCopy,currp);
    pMVar25 = Expression::cast<wasm::MemoryCopy>(this);
    goto LAB_00bfbc13;
  case MemoryFillId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitMemoryFill,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::MemoryFill>(this);
    goto LAB_00bfbc13;
  case PopId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitPop,currp);
    Expression::cast<wasm::Pop>(this);
    return;
  case RefNullId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitRefNull,currp);
    Expression::cast<wasm::RefNull>(this);
    return;
  case RefIsNullId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitRefIsNull,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::RefIsNull>(this);
    goto LAB_00bfb844;
  case RefFuncId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitRefFunc,currp);
    Expression::cast<wasm::RefFunc>(this);
    return;
  case RefEqId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitRefEq,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::RefEq>(this);
    goto LAB_00bfbc22;
  case TableGetId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitTableGet,currp);
    pGVar8 = (GlobalSet *)Expression::cast<wasm::TableGet>(this);
LAB_00bfb7a3:
    ppEVar4 = &pGVar8->value;
    goto LAB_00bfbc3a;
  case TableSetId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitTableSet,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableSet>(this);
    goto LAB_00bfba82;
  case TableSizeId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitTableSize,currp);
    Expression::cast<wasm::TableSize>(this);
    return;
  case TableGrowId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitTableGrow,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableGrow>(this);
    goto LAB_00bfba82;
  case TableFillId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitTableFill,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableFill>(this);
    goto LAB_00bfba73;
  case TableCopyId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitTableCopy,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::TableCopy>(this);
    goto LAB_00bfbc13;
  case TableInitId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitTableInit,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableInit>(this);
    goto LAB_00bfba73;
  case TryId:
    pEVar29 = &(self->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>;
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitTry,currp);
    pTVar15 = Expression::cast<wasm::Try>(this);
    uVar30 = (ulong)(uint)(pTVar15->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar15->catchBodies).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
                ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
                 ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
                 ppEVar4);
    }
    ppEVar4 = &pTVar15->body;
    goto LAB_00bfbc3a;
  case TryTableId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitTryTable,currp);
    pTVar7 = Expression::cast<wasm::TryTable>(this);
    goto LAB_00bfb844;
  case ThrowId:
    pEVar29 = &(self->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>;
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitThrow,currp);
    pTVar24 = Expression::cast<wasm::Throw>(this);
    uVar30 = (ulong)(uint)(pTVar24->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar24->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
                ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
                 ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
                 ppEVar4);
    }
    break;
  case RethrowId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitRethrow,currp);
    Expression::cast<wasm::Rethrow>(this);
    return;
  case ThrowRefId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitThrowRef,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::ThrowRef>(this);
    goto LAB_00bfb844;
  case TupleMakeId:
    pEVar29 = &(self->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>;
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitTupleMake,currp);
    pTVar27 = Expression::cast<wasm::TupleMake>(this);
    uVar30 = (ulong)(uint)(pTVar27->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar27->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
                ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
                 ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
                 ppEVar4);
    }
    break;
  case TupleExtractId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitTupleExtract,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::TupleExtract>(this);
    goto LAB_00bfb844;
  case RefI31Id:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitRefI31,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::RefI31>(this);
    goto LAB_00bfb844;
  case I31GetId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitI31Get,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::I31Get>(this);
    goto LAB_00bfb844;
  case CallRefId:
    pEVar29 = &(self->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>;
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitCallRef,currp);
    pCVar9 = Expression::cast<wasm::CallRef>(this);
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
               &pCVar9->target);
    uVar30 = (ulong)(uint)(pCVar9->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar9->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
                ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
                 ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
                 ppEVar4);
    }
    break;
  case RefTestId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitRefTest,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::RefTest>(this);
    goto LAB_00bfb844;
  case RefCastId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitRefCast,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::RefCast>(this);
    goto LAB_00bfb844;
  case BrOnId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitBrOn,currp);
    pSVar21 = (SIMDLoad *)Expression::cast<wasm::BrOn>(this);
LAB_00bfb922:
    ppEVar4 = &pSVar21->ptr;
    goto LAB_00bfbc3a;
  case StructNewId:
    pEVar29 = &(self->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>;
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitStructNew,currp);
    pSVar20 = Expression::cast<wasm::StructNew>(this);
    uVar30 = (ulong)(uint)(pSVar20->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pSVar20->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
                ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
                 ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
                 ppEVar4);
    }
    break;
  case StructGetId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitStructGet,currp);
    pSVar10 = Expression::cast<wasm::StructGet>(this);
    goto LAB_00bfba37;
  case StructSetId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitStructSet,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StructSet>(this);
    goto LAB_00bfb994;
  case StructRMWId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitStructRMW,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StructRMW>(this);
    goto LAB_00bfb994;
  case StructCmpxchgId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitStructCmpxchg,currp)
    ;
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StructCmpxchg>(this);
LAB_00bfb7c7:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
               &pAVar5->timeout);
LAB_00bfb7e0:
    ppEVar4 = &pAVar5->expected;
    goto LAB_00bfb9a2;
  case ArrayNewId:
    pEVar29 = &(self->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>;
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitArrayNew,currp);
    pAVar18 = Expression::cast<wasm::ArrayNew>(this);
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
               &pAVar18->size);
    ppEVar4 = &pAVar18->init;
LAB_00bfb681:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::maybePushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,ppEVar4
              );
    return;
  case ArrayNewDataId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitArrayNewData,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayNewData>(this);
    goto LAB_00bfba82;
  case ArrayNewElemId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitArrayNewElem,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayNewElem>(this);
    goto LAB_00bfba82;
  case ArrayNewFixedId:
    pEVar29 = &(self->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>;
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitArrayNewFixed,currp)
    ;
    pAVar28 = Expression::cast<wasm::ArrayNewFixed>(this);
    uVar30 = (ulong)(uint)(pAVar28->values).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pAVar28->values).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
                ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
                 ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
                 ppEVar4);
    }
    break;
  case ArrayGetId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitArrayGet,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArrayGet>(this);
    goto LAB_00bfbc22;
  case ArraySetId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitArraySet,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArraySet>(this);
    goto LAB_00bfbc13;
  case ArrayLenId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitArrayLen,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::ArrayLen>(this);
    goto LAB_00bfb844;
  case ArrayCopyId:
    pEVar29 = &(self->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>;
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitArrayCopy,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArrayCopy>(this);
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
               (Expression **)&(pMVar25->destMemory).super_IString.str._M_str);
    goto LAB_00bfbc04;
  case ArrayFillId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitArrayFill,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArrayFill>(this);
LAB_00bfbc04:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
               (Expression **)&pMVar25->destMemory);
    goto LAB_00bfbc13;
  case ArrayInitDataId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitArrayInitData,currp)
    ;
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayInitData>(this);
    goto LAB_00bfb299;
  case ArrayInitElemId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitArrayInitElem,currp)
    ;
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayInitElem>(this);
LAB_00bfb299:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
               (Expression **)&pAVar12->memory);
LAB_00bfba73:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
               &pAVar12->replacement);
LAB_00bfba82:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
               &pAVar12->expected);
    ppEVar4 = &pAVar12->ptr;
    goto LAB_00bfbc3a;
  case RefAsId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitRefAs,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::RefAs>(this);
    goto LAB_00bfba37;
  case StringNewId:
    pEVar29 = &(self->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>;
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitStringNew,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StringNew>(this);
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::maybePushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
               &pAVar5->timeout);
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::maybePushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
               &pAVar5->expected);
    goto LAB_00bfb9ad;
  case StringConstId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitStringConst,currp);
    Expression::cast<wasm::StringConst>(this);
    return;
  case StringMeasureId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitStringMeasure,currp)
    ;
    pSVar10 = (StructGet *)Expression::cast<wasm::StringMeasure>(this);
LAB_00bfba37:
    ppEVar4 = &pSVar10->ref;
    goto LAB_00bfbc3a;
  case StringEncodeId:
    pEVar29 = &(self->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>;
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitStringEncode,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StringEncode>(this);
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::maybePushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
               &pAVar5->timeout);
    goto LAB_00bfb7e0;
  case StringConcatId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitStringConcat,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::StringConcat>(this);
    goto LAB_00bfbc22;
  case StringEqId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitStringEq,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StringEq>(this);
LAB_00bfb994:
    ppEVar4 = &pAVar5->expected;
LAB_00bfb9a2:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,ppEVar4
              );
LAB_00bfb9ad:
    ppEVar4 = &pAVar5->ptr;
    goto LAB_00bfbc3a;
  case StringWTF16GetId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitStringWTF16Get,currp
              );
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::StringWTF16Get>(this);
    goto LAB_00bfbc22;
  case StringSliceWTFId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitStringSliceWTF,currp
              );
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::StringSliceWTF>(this);
LAB_00bfbc13:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
               &pMVar25->size);
LAB_00bfbc22:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
               &pMVar25->source);
    ppEVar4 = &pMVar25->dest;
    goto LAB_00bfbc3a;
  case ContNewId:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitContNew,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::ContNew>(this);
LAB_00bfb844:
    ppEVar4 = &pTVar7->body;
LAB_00bfbc3a:
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(self->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,ppEVar4
              );
    return;
  case ContBindId:
    pEVar29 = &(self->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>;
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitContBind,currp);
    pCVar6 = Expression::cast<wasm::ContBind>(this);
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
               &pCVar6->cont);
    uVar30 = (ulong)(uint)(pCVar6->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar6->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
                ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
                 ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
                 ppEVar4);
    }
    break;
  case SuspendId:
    pEVar29 = &(self->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>;
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitSuspend,currp);
    pSVar22 = Expression::cast<wasm::Suspend>(this);
    uVar30 = (ulong)(uint)(pSVar22->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pSVar22->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
                ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
                 ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
                 ppEVar4);
    }
    break;
  case ResumeId:
    pEVar29 = &(self->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>;
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitResume,currp);
    pRVar2 = Expression::cast<wasm::Resume>(this);
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
               &pRVar2->cont);
    uVar30 = (ulong)(uint)(pRVar2->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pRVar2->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
                ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
                 ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
                 ppEVar4);
    }
    break;
  case ResumeThrowId:
    pEVar29 = &(self->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>;
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitResumeThrow,currp);
    pRVar26 = Expression::cast<wasm::ResumeThrow>(this);
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
               &pRVar26->cont);
    uVar30 = (ulong)(uint)(pRVar26->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pRVar26->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
                ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
                 ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
                 ppEVar4);
    }
    break;
  case StackSwitchId:
    pEVar29 = &(self->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>;
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::doVisitStackSwitch,currp);
    pSVar3 = Expression::cast<wasm::StackSwitch>(this);
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
               ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
               &pSVar3->cont);
    uVar30 = (ulong)(uint)(pSVar3->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pSVar3->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::pushTask
                ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)pEVar29,
                 ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::scan,
                 ppEVar4);
    }
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }